

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool prvTidySetOptionInt(TidyDocImpl *doc,TidyOptionId optId,ulong val)

{
  Bool status;
  ulong val_local;
  TidyOptionId optId_local;
  TidyDocImpl *doc_local;
  
  if (optId < N_TIDY_OPTIONS != no) {
    if (option_defs[optId].type != TidyInteger) {
      __assert_fail("option_defs[ optId ].type == TidyInteger",
                    "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/config.c"
                    ,0x1e6,"Bool prvTidySetOptionInt(TidyDocImpl *, TidyOptionId, ulong)");
    }
    SetOptionInteger(doc,optId,val);
  }
  return (uint)(optId < N_TIDY_OPTIONS);
}

Assistant:

Bool TY_(SetOptionInt)( TidyDocImpl* doc, TidyOptionId optId, ulong val )
{
    Bool status = ( optId < N_TIDY_OPTIONS );
    if ( status )
    {
        assert( option_defs[ optId ].type == TidyInteger );
        SetOptionInteger( doc, optId, val );
    }
    return status;
}